

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

TestRequest *
anon_unknown.dwarf_5319c9::createTestRequest
          (TestRequest *__return_storage_ptr__,char *sender,char *target,int seq,char *id)

{
  undefined1 *this;
  int iVar1;
  long *local_98;
  long local_90;
  long local_88 [2];
  undefined1 local_78 [16];
  _Alloc_hider local_68;
  char local_58 [16];
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  field_metrics local_28;
  
  FIX42::TestRequest::TestRequest(__return_storage_ptr__);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"HELLO","");
  local_78._0_8_ = &PTR__FieldBase_003239f8;
  local_78._8_4_ = 0x70;
  local_68._M_p = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_98,local_90 + (long)local_98);
  local_48._M_p = (pointer)&local_38;
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_28.m_length = 0;
  local_28.m_checksum = 0;
  local_78._0_8_ = &PTR__FieldBase_00327870;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,(FieldBase *)local_78,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_78);
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,"ISLD","TW",(int)sender);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::IntField::IntField((IntField *)local_78,9,iVar1);
  local_78._0_8_ = &PTR__FieldBase_00327ea8;
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)local_78,true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_78);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSumField::CheckSumField((CheckSumField *)local_78,10,iVar1);
  local_78._0_8_ = &PTR__FieldBase_00328060;
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,(FieldBase *)local_78,
             true);
  FIX::FieldBase::~FieldBase((FieldBase *)local_78);
  return __return_storage_ptr__;
}

Assistant:

FIX42::TestRequest createTestRequest(const char *sender, const char *target, int seq, const char *id) {
  FIX42::TestRequest testRequest;
  testRequest.set(TestReqID(id));
  fillHeader(testRequest.getHeader(), sender, target, seq);
  testRequest.getHeader().setField(BodyLength(testRequest.bodyLength()));
  testRequest.getTrailer().setField(CheckSum(testRequest.checkSum()));
  return testRequest;
}